

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O2

int __thiscall
cmCPackGenerator::InstallProjectViaInstalledDirectories
          (cmCPackGenerator *this,bool setDestDir,string *tempInstallDirectory)

{
  string *filename;
  cmCPackLog *pcVar1;
  string *origName;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  ostream *poVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  pointer pbVar6;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar7;
  int iVar8;
  _List_node_base *p_Var9;
  pointer inName;
  pointer this_00;
  string targetFile;
  string inFile;
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  symlinkedFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ignoreFilesRegexString;
  string inFileRelative;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  installDirectoriesVector;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> ignoreFilesRegex;
  string filePath;
  Glob gl;
  string findExpr;
  string subdir;
  ostringstream cmCPackLog_msg;
  string local_50;
  
  ignoreFilesRegex.
  super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ignoreFilesRegex.
  super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ignoreFilesRegex.
  super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&cmCPackLog_msg,"CPACK_IGNORE_FILES",(allocator *)&gl);
  pcVar4 = GetOption(this,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  if (pcVar4 != (char *)0x0) {
    ignoreFilesRegexString.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ignoreFilesRegexString.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ignoreFilesRegexString.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&cmCPackLog_msg,pcVar4,(allocator *)&gl);
    cmSystemTools::ExpandListArgument((string *)&cmCPackLog_msg,&ignoreFilesRegexString,false);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    for (pbVar6 = ignoreFilesRegexString.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar6 != ignoreFilesRegexString.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar6 = pbVar6 + 1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"Create ignore files regex for: ");
      poVar5 = std::operator<<(poVar5,(string *)pbVar6);
      std::endl<char,std::char_traits<char>>(poVar5);
      pcVar1 = this->Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,2,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x14d,(char *)gl.Internals);
      std::__cxx11::string::~string((string *)&gl);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
      cmsys::RegularExpression::RegularExpression
                ((RegularExpression *)&cmCPackLog_msg,(pbVar6->_M_dataplus)._M_p);
      std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
      emplace_back<cmsys::RegularExpression>(&ignoreFilesRegex,(RegularExpression *)&cmCPackLog_msg)
      ;
      cmsys::RegularExpression::~RegularExpression((RegularExpression *)&cmCPackLog_msg);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&ignoreFilesRegexString);
  }
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_INSTALLED_DIRECTORIES",(allocator *)&gl);
  pcVar4 = GetOption(this,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  iVar8 = 1;
  if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
    installDirectoriesVector.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    installDirectoriesVector.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    installDirectoriesVector.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&cmCPackLog_msg,pcVar4,(allocator *)&gl);
    cmSystemTools::ExpandListArgument((string *)&cmCPackLog_msg,&installDirectoriesVector,false);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (((int)installDirectoriesVector.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
         (int)installDirectoriesVector.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start & 0x20U) == 0) {
      pbVar6 = installDirectoriesVector.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      while( true ) {
        if (pbVar6 == installDirectoriesVector.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) break;
        symlinkedFiles.
        super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl._M_node._M_size = 0;
        symlinkedFiles.
        super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&symlinkedFiles;
        symlinkedFiles.
        super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&symlinkedFiles;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"Find files");
        std::endl<char,std::char_traits<char>>(poVar5);
        pcVar1 = this->Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar1,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x167,(char *)gl.Internals);
        std::__cxx11::string::~string((string *)&gl);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
        cmsys::Glob::Glob(&gl);
        std::__cxx11::string::string((string *)&ignoreFilesRegexString,(string *)pbVar6);
        std::__cxx11::string::string((string *)&subdir,(string *)(pbVar6 + 1));
        std::__cxx11::string::string((string *)&findExpr,(string *)&ignoreFilesRegexString);
        std::__cxx11::string::append((char *)&findExpr);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"- Install directory: ");
        poVar5 = std::operator<<(poVar5,(string *)&ignoreFilesRegexString);
        std::endl<char,std::char_traits<char>>(poVar5);
        pcVar1 = this->Logger;
        std::__cxx11::stringbuf::str();
        pcVar4 = (char *)0x16f;
        cmCPackLog::Log(pcVar1,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x16f,inFile._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&inFile);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
        gl.Recurse = true;
        gl.RecurseListDirs = true;
        bVar2 = cmsys::Glob::FindFiles(&gl,&findExpr,(GlobMessages *)0x0);
        if (!bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
          poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,
                                   "Cannot find any files in the installed directory");
          std::endl<char,std::char_traits<char>>(poVar5);
          pcVar1 = this->Logger;
          std::__cxx11::stringbuf::str();
          cmCPackLog::Log(pcVar1,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x175,inFile._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&inFile);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
LAB_00280f14:
          std::__cxx11::string::~string((string *)&findExpr);
          std::__cxx11::string::~string((string *)&subdir);
          std::__cxx11::string::~string((string *)&ignoreFilesRegexString);
          cmsys::Glob::~Glob(&gl);
          std::__cxx11::
          _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_M_clear(&symlinkedFiles.
                      super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    );
          goto LAB_00280f4f;
        }
        __x = cmsys::Glob::GetFiles_abi_cxx11_(&gl);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&this->files,__x);
        uVar7 = extraout_RDX;
        for (inName = (this->files).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            inName != (this->files).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish; inName = inName + 1) {
          std::__cxx11::string::string((string *)&inFile,(string *)inName);
          bVar2 = cmsys::SystemTools::FileIsDirectory(inName);
          if (bVar2) {
            std::__cxx11::string::push_back((char)&inFile);
          }
          bVar2 = false;
          for (this_00 = ignoreFilesRegex.
                         super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              this_00 !=
              ignoreFilesRegex.
              super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
              ._M_impl.super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
            bVar3 = cmsys::RegularExpression::find(this_00,inFile._M_dataplus._M_p);
            if (bVar3) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
              poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"Ignore file: ");
              poVar5 = std::operator<<(poVar5,(string *)&inFile);
              std::endl<char,std::char_traits<char>>(poVar5);
              pcVar1 = this->Logger;
              std::__cxx11::stringbuf::str();
              pcVar4 = (char *)0x18a;
              cmCPackLog::Log(pcVar1,2,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                              ,0x18a,filePath._M_dataplus._M_p);
              std::__cxx11::string::~string((string *)&filePath);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
              bVar2 = true;
            }
          }
          if (bVar2) {
            std::__cxx11::string::~string((string *)&inFile);
            uVar7 = extraout_RDX_00;
          }
          else {
            std::__cxx11::string::string((string *)&filePath,(string *)tempInstallDirectory);
            std::operator+(&inFileRelative,"/",&subdir);
            std::operator+(&targetFile,&inFileRelative,"/");
            cmSystemTools::RelativePath_abi_cxx11_
                      (&local_50,
                       (cmSystemTools *)
                       ignoreFilesRegexString.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,(inName->_M_dataplus)._M_p,pcVar4);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &cmCPackLog_msg,&targetFile,&local_50);
            std::__cxx11::string::append((string *)&filePath);
            std::__cxx11::string::~string((string *)&cmCPackLog_msg);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&targetFile);
            std::__cxx11::string::~string((string *)&inFileRelative);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
            poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"Copy file: ");
            poVar5 = std::operator<<(poVar5,(string *)&inFile);
            poVar5 = std::operator<<(poVar5," -> ");
            poVar5 = std::operator<<(poVar5,(string *)&filePath);
            std::endl<char,std::char_traits<char>>(poVar5);
            pcVar1 = this->Logger;
            std::__cxx11::stringbuf::str();
            pcVar4 = (char *)0x196;
            cmCPackLog::Log(pcVar1,4,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                            ,0x196,targetFile._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&targetFile);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
            bVar2 = cmsys::SystemTools::FileIsSymlink(&inFile);
            if (!bVar2) {
              bVar2 = cmSystemTools::CopyFileIfDifferent
                                (inFile._M_dataplus._M_p,filePath._M_dataplus._M_p);
              if (bVar2) {
                bVar2 = cmSystemTools::CopyFileTime
                                  (inFile._M_dataplus._M_p,filePath._M_dataplus._M_p);
                if (bVar2) goto LAB_00280995;
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
              poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"Problem copying file: ");
              poVar5 = std::operator<<(poVar5,(string *)&inFile);
              poVar5 = std::operator<<(poVar5," -> ");
              poVar5 = std::operator<<(poVar5,(string *)&filePath);
              std::endl<char,std::char_traits<char>>(poVar5);
              pcVar1 = this->Logger;
              std::__cxx11::stringbuf::str();
              cmCPackLog::Log(pcVar1,0x10,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                              ,0x1a9,targetFile._M_dataplus._M_p);
              std::__cxx11::string::~string((string *)&targetFile);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
              std::__cxx11::string::~string((string *)&filePath);
              std::__cxx11::string::~string((string *)&inFile);
              goto LAB_00280f14;
            }
            targetFile._M_dataplus._M_p = (pointer)&targetFile.field_2;
            targetFile._M_string_length = 0;
            targetFile.field_2._M_local_buf[0] = '\0';
            cmSystemTools::RelativePath_abi_cxx11_
                      (&inFileRelative,
                       (cmSystemTools *)
                       ignoreFilesRegexString.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,inFile._M_dataplus._M_p,pcVar4);
            cmsys::SystemTools::ReadSymlink(&inFile,&targetFile);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&cmCPackLog_msg,&targetFile,&inFileRelative);
            std::__cxx11::
            list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::push_back(&symlinkedFiles,
                        (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&cmCPackLog_msg);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&cmCPackLog_msg);
            std::__cxx11::string::~string((string *)&inFileRelative);
            std::__cxx11::string::~string((string *)&targetFile);
LAB_00280995:
            std::__cxx11::string::~string((string *)&filePath);
            std::__cxx11::string::~string((string *)&inFile);
            uVar7 = extraout_RDX_01;
          }
        }
        if (symlinkedFiles.
            super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&symlinkedFiles) {
          cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
                    (&inFile,(SystemTools *)0x1,SUB81(uVar7,0));
          std::__cxx11::string::string((string *)&filePath,(string *)tempInstallDirectory);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &cmCPackLog_msg,"/",&subdir);
          std::__cxx11::string::append((string *)&filePath);
          std::__cxx11::string::~string((string *)&cmCPackLog_msg);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
          poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"Change dir to: ");
          poVar5 = std::operator<<(poVar5,(string *)&filePath);
          std::endl<char,std::char_traits<char>>(poVar5);
          pcVar1 = this->Logger;
          std::__cxx11::stringbuf::str();
          cmCPackLog::Log(pcVar1,4,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x1b5,targetFile._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&targetFile);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
          cmsys::SystemTools::ChangeDirectory(&filePath);
          p_Var9 = (_List_node_base *)&symlinkedFiles;
          while (p_Var9 = (((_List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&p_Var9->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
                p_Var9 != (_List_node_base *)&symlinkedFiles) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
            poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"Will create a symlink: ");
            filename = (string *)(p_Var9 + 3);
            poVar5 = std::operator<<(poVar5,(string *)filename);
            poVar5 = std::operator<<(poVar5,"--> ");
            origName = (string *)(p_Var9 + 1);
            poVar5 = std::operator<<(poVar5,(string *)origName);
            std::endl<char,std::char_traits<char>>(poVar5);
            pcVar1 = this->Logger;
            std::__cxx11::stringbuf::str();
            cmCPackLog::Log(pcVar1,4,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                            ,0x1bd,targetFile._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&targetFile);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
            cmsys::SystemTools::GetFilenamePath(&targetFile,filename);
            if (targetFile._M_string_length != 0) {
              bVar2 = cmsys::SystemTools::MakeDirectory(&targetFile);
              if (!bVar2) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
                poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"Cannot create dir: ");
                poVar5 = std::operator<<(poVar5,(string *)&targetFile);
                poVar5 = std::operator<<(poVar5,"\nTrying to create symlink: ");
                poVar5 = std::operator<<(poVar5,(string *)filename);
                poVar5 = std::operator<<(poVar5,"--> ");
                poVar5 = std::operator<<(poVar5,(string *)origName);
                std::endl<char,std::char_traits<char>>(poVar5);
                pcVar1 = this->Logger;
                std::__cxx11::stringbuf::str();
                cmCPackLog::Log(pcVar1,0x10,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                                ,0x1c8,inFileRelative._M_dataplus._M_p);
                std::__cxx11::string::~string((string *)&inFileRelative);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
              }
            }
            bVar2 = cmsys::SystemTools::CreateSymlink(origName,filename);
            if (!bVar2) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
              poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"Cannot create symlink: ");
              poVar5 = std::operator<<(poVar5,(string *)filename);
              poVar5 = std::operator<<(poVar5,"--> ");
              poVar5 = std::operator<<(poVar5,(string *)origName);
              std::endl<char,std::char_traits<char>>(poVar5);
              pcVar1 = this->Logger;
              std::__cxx11::stringbuf::str();
              cmCPackLog::Log(pcVar1,0x10,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                              ,0x1cf,inFileRelative._M_dataplus._M_p);
              std::__cxx11::string::~string((string *)&inFileRelative);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
              std::__cxx11::string::~string((string *)&targetFile);
              goto LAB_00280d6c;
            }
            std::__cxx11::string::~string((string *)&targetFile);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
          poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"Going back to: ");
          poVar5 = std::operator<<(poVar5,(string *)&inFile);
          std::endl<char,std::char_traits<char>>(poVar5);
          pcVar1 = this->Logger;
          std::__cxx11::stringbuf::str();
          cmCPackLog::Log(pcVar1,4,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x1d4,targetFile._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&targetFile);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
          cmsys::SystemTools::ChangeDirectory(&inFile);
LAB_00280d6c:
          std::__cxx11::string::~string((string *)&filePath);
          std::__cxx11::string::~string((string *)&inFile);
          if (p_Var9 != (_List_node_base *)&symlinkedFiles) goto LAB_00280f14;
        }
        std::__cxx11::string::~string((string *)&findExpr);
        std::__cxx11::string::~string((string *)&subdir);
        std::__cxx11::string::~string((string *)&ignoreFilesRegexString);
        cmsys::Glob::~Glob(&gl);
        std::__cxx11::
        _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_M_clear(&symlinkedFiles.
                    super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  );
        pbVar6 = pbVar6 + 2;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&installDirectoriesVector);
      iVar8 = 1;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,
                               "CPACK_INSTALLED_DIRECTORIES should contain pairs of <directory> and <subdirectory>. The <subdirectory> can be \'.\' to be installed in the toplevel directory of installation."
                              );
      std::endl<char,std::char_traits<char>>(poVar5);
      pcVar1 = this->Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x15d,(char *)gl.Internals);
      std::__cxx11::string::~string((string *)&gl);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
LAB_00280f4f:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&installDirectoriesVector);
      iVar8 = 0;
    }
  }
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::~vector
            (&ignoreFilesRegex);
  return iVar8;
}

Assistant:

int cmCPackGenerator::InstallProjectViaInstalledDirectories(
  bool setDestDir, const std::string& tempInstallDirectory)
{
  (void)setDestDir;
  (void)tempInstallDirectory;
  std::vector<cmsys::RegularExpression> ignoreFilesRegex;
  const char* cpackIgnoreFiles = this->GetOption("CPACK_IGNORE_FILES");
  if ( cpackIgnoreFiles )
    {
    std::vector<std::string> ignoreFilesRegexString;
    cmSystemTools::ExpandListArgument(cpackIgnoreFiles,
                                      ignoreFilesRegexString);
    std::vector<std::string>::iterator it;
    for ( it = ignoreFilesRegexString.begin();
      it != ignoreFilesRegexString.end();
      ++it )
      {
      cmCPackLogger(cmCPackLog::LOG_VERBOSE,
        "Create ignore files regex for: " << *it << std::endl);
      ignoreFilesRegex.push_back(it->c_str());
      }
    }
  const char* installDirectories
    = this->GetOption("CPACK_INSTALLED_DIRECTORIES");
  if ( installDirectories && *installDirectories )
    {
    std::vector<std::string> installDirectoriesVector;
    cmSystemTools::ExpandListArgument(installDirectories,
      installDirectoriesVector);
    if ( installDirectoriesVector.size() % 2 != 0 )
      {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
        "CPACK_INSTALLED_DIRECTORIES should contain pairs of <directory> and "
        "<subdirectory>. The <subdirectory> can be '.' to be installed in "
        "the toplevel directory of installation." << std::endl);
      return 0;
      }
    std::vector<std::string>::iterator it;
    const std::string& tempDir = tempInstallDirectory;
    for ( it = installDirectoriesVector.begin();
      it != installDirectoriesVector.end();
      ++it )
      {
      std::list<std::pair<std::string,std::string> > symlinkedFiles;
      cmCPackLogger(cmCPackLog::LOG_DEBUG, "Find files" << std::endl);
      cmsys::Glob gl;
      std::string top = *it;
      it ++;
      std::string subdir = *it;
      std::string findExpr = top;
      findExpr += "/*";
      cmCPackLogger(cmCPackLog::LOG_OUTPUT,
        "- Install directory: " << top << std::endl);
      gl.RecurseOn();
      gl.SetRecurseListDirs(true);
      if ( !gl.FindFiles(findExpr) )
        {
        cmCPackLogger(cmCPackLog::LOG_ERROR,
          "Cannot find any files in the installed directory" << std::endl);
        return 0;
        }
      files = gl.GetFiles();
      std::vector<std::string>::iterator gfit;
      std::vector<cmsys::RegularExpression>::iterator regIt;
      for ( gfit = files.begin(); gfit != files.end(); ++ gfit )
        {
        bool skip = false;
        std::string inFile = *gfit;
        if(cmSystemTools::FileIsDirectory(*gfit))
          {
          inFile += '/';
          }
        for ( regIt= ignoreFilesRegex.begin();
          regIt!= ignoreFilesRegex.end();
          ++ regIt)
          {
          if ( regIt->find(inFile.c_str()) )
            {
            cmCPackLogger(cmCPackLog::LOG_VERBOSE, "Ignore file: "
              << inFile << std::endl);
            skip = true;
            }
          }
        if ( skip )
          {
          continue;
          }
        std::string filePath = tempDir;
        filePath += "/" + subdir + "/"
          + cmSystemTools::RelativePath(top.c_str(), gfit->c_str());
        cmCPackLogger(cmCPackLog::LOG_DEBUG, "Copy file: "
          << inFile << " -> " << filePath << std::endl);
        /* If the file is a symlink we will have to re-create it */
        if ( cmSystemTools::FileIsSymlink(inFile))
          {
          std::string targetFile;
          std::string inFileRelative =
             cmSystemTools::RelativePath(top.c_str(),inFile.c_str());
          cmSystemTools::ReadSymlink(inFile,targetFile);
          symlinkedFiles.push_back(std::pair<std::string,
                                   std::string>(targetFile,inFileRelative));
          }
        /* If it is not a symlink then do a plain copy */
        else if (!(
            cmSystemTools::CopyFileIfDifferent(inFile.c_str(),filePath.c_str())
            &&
            cmSystemTools::CopyFileTime(inFile.c_str(),filePath.c_str())
                ) )
          {
          cmCPackLogger(cmCPackLog::LOG_ERROR, "Problem copying file: "
            << inFile << " -> " << filePath << std::endl);
          return 0;
          }
        }
      /* rebuild symlinks in the installed tree */
      if (!symlinkedFiles.empty())
        {
        std::list< std::pair<std::string,std::string> >::iterator symlinkedIt;
        std::string curDir = cmSystemTools::GetCurrentWorkingDirectory();
        std::string goToDir = tempDir;
        goToDir  += "/"+subdir;
        cmCPackLogger(cmCPackLog::LOG_DEBUG,
                      "Change dir to: " << goToDir <<std::endl);
        cmSystemTools::ChangeDirectory(goToDir);
        for (symlinkedIt=symlinkedFiles.begin();
             symlinkedIt != symlinkedFiles.end();
             ++symlinkedIt)
          {
          cmCPackLogger(cmCPackLog::LOG_DEBUG, "Will create a symlink: "
                         << symlinkedIt->second << "--> "
                         << symlinkedIt->first << std::endl);
          // make sure directory exists for symlink
          std::string destDir =
            cmSystemTools::GetFilenamePath(symlinkedIt->second);
          if(!destDir.empty() && !cmSystemTools::MakeDirectory(destDir))
            {
            cmCPackLogger(cmCPackLog::LOG_ERROR, "Cannot create dir: "
                          << destDir
                          << "\nTrying to create symlink: "
                          << symlinkedIt->second << "--> "
                          << symlinkedIt->first
                          << std::endl);
            }
          if (!cmSystemTools::CreateSymlink(symlinkedIt->first,
                                            symlinkedIt->second))
            {
            cmCPackLogger(cmCPackLog::LOG_ERROR, "Cannot create symlink: "
                            << symlinkedIt->second << "--> "
                            << symlinkedIt->first << std::endl);
            return 0;
            }
          }
        cmCPackLogger(cmCPackLog::LOG_DEBUG, "Going back to: "
                      << curDir <<std::endl);
        cmSystemTools::ChangeDirectory(curDir);
        }
      }
    }
  return 1;
}